

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecPrint(Sfm_Dec_t *p,word (*Masks) [8])

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Mio_Gate_t *pGate;
  char *pcVar5;
  word *pwVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  
  for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
    p_00 = Vec_WecEntry(&p->vObjFanins,p->iTarget);
    pcVar10 = "OFF";
    if (uVar9 == 0) {
      pcVar10 = "ON";
    }
    iVar7 = p->nDivs;
    iVar3 = p->iTarget;
    iVar1 = Vec_IntEntry(&p->vObjGates,iVar3);
    pGate = (Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands,iVar1);
    pcVar5 = Mio_GateReadName(pGate);
    printf("%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ",pcVar10,iVar3,iVar7,
           pcVar5);
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      uVar2 = Vec_IntEntry(p_00,iVar7);
      printf("%d ",(ulong)uVar2);
    }
    putchar(10);
    printf("Implications: ");
    for (iVar7 = 0; iVar7 < p->vImpls[uVar9].nSize; iVar7 = iVar7 + 1) {
      iVar3 = Vec_IntEntry(p->vImpls + uVar9,iVar7);
      iVar1 = Abc_LitIsCompl(iVar3);
      pcVar10 = "!";
      if (iVar1 == 0) {
        pcVar10 = "";
      }
      uVar2 = Abc_Lit2Var(iVar3);
      uVar4 = Sfm_DecFindCost(p,(int)uVar9,iVar3,Masks[uVar9 & 0xffffffff ^ 1]);
      printf("%s%d(%d) ",pcVar10,(ulong)uVar2,(ulong)uVar4);
    }
    putchar(10);
    printf("     ");
    for (uVar2 = 0; (int)uVar2 < p->nDivs; uVar2 = uVar2 + 1) {
      printf("%d",((ulong)uVar2 / 10) % 10);
    }
    putchar(10);
    uVar8 = 0;
    printf("     ");
    while( true ) {
      if (p->nDivs <= (int)uVar8) break;
      printf("%d",uVar8 % 10);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    putchar(10);
    for (uVar2 = 0; (int)uVar2 < p->nPats[uVar9]; uVar2 = uVar2 + 1) {
      printf("%2d : ",(ulong)uVar2);
      for (iVar7 = 0; iVar7 < p->nDivs; iVar7 = iVar7 + 1) {
        pwVar6 = Sfm_DecDivPats(p,iVar7,(int)uVar9);
        printf("%d",(ulong)((pwVar6[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0));
      }
      putchar(10);
    }
  }
  return;
}

Assistant:

void Sfm_DecPrint( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int c, i, k, Entry;
    for ( c = 0; c < 2; c++ )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( &p->vObjFanins, p->iTarget );
        printf( "%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ", 
            c ? "OFF": "ON", p->iTarget, p->nDivs, 
            Mio_GateReadName((Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands, Vec_IntEntry(&p->vObjGates,p->iTarget))) );
        Vec_IntForEachEntry( vLevel, Entry, i )
            printf( "%d ", Entry );
        printf( "\n" );

        printf( "Implications: " );
        Vec_IntForEachEntry( &p->vImpls[c], Entry, i )
            printf( "%s%d(%d) ", Abc_LitIsCompl(Entry)? "!":"", Abc_Lit2Var(Entry), Sfm_DecFindCost(p, c, Entry, Masks[!c]) );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", (i / 10) % 10 );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
        for ( k = 0; k < p->nPats[c]; k++ )
        {
            printf( "%2d : ", k );
            for ( i = 0; i < p->nDivs; i++ )
                printf( "%d", Abc_TtGetBit(Sfm_DecDivPats(p, i, c), k) );
            printf( "\n" );
        }
        //printf( "\n" );
    }
}